

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O2

void FindFirstSets(lemon *lemp)

{
  Boolean BVar1;
  rule *prVar2;
  symbol *psVar3;
  symbol *psVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  char *pcVar8;
  ulong uVar9;
  ulong uVar10;
  rule **pprVar11;
  rule **pprVar12;
  int iVar13;
  long lVar14;
  bool bVar15;
  
  uVar6 = lemp->nsymbol;
  uVar9 = 0;
  uVar10 = 0;
  if (0 < (int)uVar6) {
    uVar10 = (ulong)uVar6;
  }
  for (; uVar10 != uVar9; uVar9 = uVar9 + 1) {
    lemp->symbols[uVar9]->lambda = LEMON_FALSE;
  }
  for (lVar14 = (long)lemp->nterminal; lVar14 < (int)uVar6; lVar14 = lVar14 + 1) {
    pcVar8 = SetNew();
    lemp->symbols[lVar14]->firstset = pcVar8;
    uVar6 = lemp->nsymbol;
  }
  pprVar12 = &lemp->rule;
  pprVar11 = pprVar12;
  bVar15 = false;
  do {
    while (prVar2 = *pprVar11, prVar2 == (rule *)0x0) {
      bVar5 = !bVar15;
      pprVar11 = pprVar12;
      bVar15 = false;
      if (bVar5) {
        iVar13 = 0;
        do {
          while (prVar2 = *pprVar11, prVar2 == (rule *)0x0) {
            bVar15 = iVar13 == 0;
            iVar13 = 0;
            pprVar11 = pprVar12;
            if (bVar15) {
              return;
            }
          }
          psVar3 = prVar2->lhs;
          lVar14 = 0;
          while( true ) {
            if (prVar2->nrhs <= lVar14) goto LAB_001029cf;
            psVar4 = prVar2->rhs[lVar14];
            if (psVar4->type == TERMINAL) {
              iVar7 = SetAdd(psVar3->firstset,psVar4->index);
              iVar13 = iVar13 + iVar7;
              goto LAB_001029cf;
            }
            if (psVar4->type == MULTITERMINAL) break;
            if (psVar3 == psVar4) {
              BVar1 = psVar3->lambda;
            }
            else {
              iVar7 = SetUnion(psVar3->firstset,psVar4->firstset);
              iVar13 = iVar13 + iVar7;
              BVar1 = psVar4->lambda;
            }
            if (BVar1 == LEMON_FALSE) goto LAB_001029cf;
            lVar14 = lVar14 + 1;
          }
          for (lVar14 = 0; lVar14 < psVar4->nsubsym; lVar14 = lVar14 + 1) {
            iVar7 = SetAdd(psVar3->firstset,psVar4->subsym[lVar14]->index);
            iVar13 = iVar13 + iVar7;
          }
LAB_001029cf:
          pprVar11 = &prVar2->next;
        } while( true );
      }
    }
    if (prVar2->lhs->lambda == LEMON_FALSE) {
      uVar6 = prVar2->nrhs;
      uVar9 = 0;
      if (0 < (int)uVar6) {
        uVar9 = (ulong)uVar6;
      }
      for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
        psVar3 = prVar2->rhs[uVar10];
        if (psVar3->type != NONTERMINAL) {
          if (psVar3->lambda != LEMON_FALSE) {
            __assert_fail("sp->type==NONTERMINAL || sp->lambda==LEMON_FALSE",
                          "/workspace/llm4binary/github/license_c_cmakelists/meme[P]hexxed/lemon.c",
                          0x35b,"void FindFirstSets(struct lemon *)");
          }
LAB_0010293a:
          uVar9 = uVar10 & 0xffffffff;
          break;
        }
        if (psVar3->lambda == LEMON_FALSE) goto LAB_0010293a;
      }
      if ((uint)uVar9 == uVar6) {
        prVar2->lhs->lambda = LEMON_TRUE;
        bVar15 = true;
      }
    }
    pprVar11 = &prVar2->next;
  } while( true );
}

Assistant:

void FindFirstSets(struct lemon *lemp)
{
  int i, j;
  struct rule *rp;
  int progress;

  for(i=0; i<lemp->nsymbol; i++){
    lemp->symbols[i]->lambda = LEMON_FALSE;
  }
  for(i=lemp->nterminal; i<lemp->nsymbol; i++){
    lemp->symbols[i]->firstset = SetNew();
  }

  /* First compute all lambdas */
  do{
    progress = 0;
    for(rp=lemp->rule; rp; rp=rp->next){
      if( rp->lhs->lambda ) continue;
      for(i=0; i<rp->nrhs; i++){
        struct symbol *sp = rp->rhs[i];
        assert( sp->type==NONTERMINAL || sp->lambda==LEMON_FALSE );
        if( sp->lambda==LEMON_FALSE ) break;
      }
      if( i==rp->nrhs ){
        rp->lhs->lambda = LEMON_TRUE;
        progress = 1;
      }
    }
  }while( progress );

  /* Now compute all first sets */
  do{
    struct symbol *s1, *s2;
    progress = 0;
    for(rp=lemp->rule; rp; rp=rp->next){
      s1 = rp->lhs;
      for(i=0; i<rp->nrhs; i++){
        s2 = rp->rhs[i];
        if( s2->type==TERMINAL ){
          progress += SetAdd(s1->firstset,s2->index);
          break;
        }else if( s2->type==MULTITERMINAL ){
          for(j=0; j<s2->nsubsym; j++){
            progress += SetAdd(s1->firstset,s2->subsym[j]->index);
          }
          break;
        }else if( s1==s2 ){
          if( s1->lambda==LEMON_FALSE ) break;
        }else{
          progress += SetUnion(s1->firstset,s2->firstset);
          if( s2->lambda==LEMON_FALSE ) break;
        }
      }
    }
  }while( progress );
  return;
}